

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool close_connection,bool *connection_closed,
          function<void_(httplib::Request_&)> *setup_request)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree_header *p_Var1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  _Var3;
  uint __val;
  Server *pSVar4;
  Stream *pSVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  __ssize_t _Var10;
  iterator iVar11;
  _Base_ptr p_Var12;
  _Alloc_hider _Var13;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *p_Var14;
  const_iterator cVar15;
  uint uVar16;
  size_t sVar17;
  string *psVar18;
  long lVar19;
  char cVar20;
  size_t *__n;
  ulong uVar21;
  char **__lineptr;
  char *pcVar22;
  uint uVar23;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *__first;
  uint __len;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar24;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar25;
  Headers dummy;
  int status;
  stream_line_reader line_reader;
  Request req;
  array<char,_2048UL> buf;
  undefined1 local_c18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08;
  _Base_ptr local_bf8;
  size_t local_bf0;
  Server *local_be8;
  Stream *local_be0;
  long *local_bd8 [2];
  long local_bc8 [2];
  bool *local_bb8;
  _Any_data *local_bb0;
  stream_line_reader local_ba8;
  undefined1 local_b68 [80];
  _Rb_tree_node_base local_b18;
  size_t local_af8;
  _Alloc_hider local_af0;
  size_type local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  _Alloc_hider local_ad0;
  size_type local_ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac0;
  size_t local_ab0;
  _Any_data _Stack_aa8;
  _Manager_type p_Stack_a98;
  _Invoker_type local_a90;
  _Any_data _Stack_a88;
  undefined2 uStack_a78;
  undefined6 uStack_a76;
  undefined2 uStack_a70;
  undefined8 uStack_a6e;
  undefined1 local_a60 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a20;
  _Alloc_hider local_9f0;
  size_type local_9e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  uint local_9b0 [2];
  _Alloc_hider local_9a8;
  size_type local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  _Alloc_hider local_988;
  size_type local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  _Rb_tree_node_base local_960;
  size_t local_940;
  _Rb_tree_node_base local_930;
  undefined1 local_910 [8];
  Ranges local_908 [6];
  size_t local_870;
  size_t local_868;
  _Any_data _Stack_860;
  undefined1 uStack_850;
  undefined7 uStack_84f;
  undefined1 uStack_848;
  undefined8 uStack_847;
  size_t local_838;
  char local_830 [2048];
  
  __lineptr = (char **)0x0;
  local_bb8 = connection_closed;
  local_bb0 = (_Any_data *)setup_request;
  memset(local_830,0,0x800);
  local_ba8.glowable_buffer_._M_dataplus._M_p = (pointer)&local_ba8.glowable_buffer_.field_2;
  local_ba8.fixed_buffer_size_ = 0x800;
  local_ba8.fixed_buffer_used_size_ = 0;
  local_ba8.glowable_buffer_._M_string_length = 0;
  local_ba8.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  local_ba8.strm_ = strm;
  local_ba8.fixed_buffer_ = local_830;
  _Var10 = detail::stream_line_reader::getline(&local_ba8,__lineptr,__n,(FILE *)connection_closed);
  bVar6 = 0;
  if ((char)_Var10 == '\0') goto LAB_0013d439;
  local_a60._0_8_ = local_a60 + 0x10;
  local_a60._8_8_ = 0;
  local_a60[0x10] = '\0';
  local_a60._32_8_ = local_a60 + 0x30;
  local_a60._40_8_ = 0;
  local_a60[0x30] = '\0';
  local_a20._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a20._M_impl.super__Rb_tree_header._M_header;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a20._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_9f0._M_p = (pointer)&local_9e0;
  local_9e8 = 0;
  local_9e0._M_local_buf[0] = '\0';
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  local_9d0._M_string_length = 0;
  local_9d0.field_2._M_local_buf[0] = '\0';
  local_9b0[0] = 0xffffffff;
  local_9a8._M_p = (pointer)&local_998;
  local_9a0 = 0;
  local_998._M_local_buf[0] = '\0';
  local_988._M_p = (pointer)&local_978;
  local_980 = 0;
  local_978._M_local_buf[0] = '\0';
  local_960._M_left = &local_960;
  local_960._M_color = _S_red;
  local_960._M_parent = (_Base_ptr)0x0;
  local_940 = 0;
  local_930._M_left = &local_930;
  local_930._M_color = _S_red;
  local_930._M_parent = (_Base_ptr)0x0;
  local_a20._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a20._M_impl.super__Rb_tree_header._M_header._M_left;
  local_960._M_right = local_960._M_left;
  local_930._M_right = local_930._M_left;
  memset(local_910,0,0xa0);
  local_870 = 0x14;
  local_838 = 0;
  local_868 = 0;
  _Stack_860._M_unused._M_object = (void *)0x0;
  _Stack_860._8_8_ = 0;
  uStack_850 = 0;
  uStack_84f = 0;
  uStack_848 = 0;
  uStack_847 = 0;
  local_b68._0_8_ = local_b68 + 0x10;
  local_b68._8_8_ = 0;
  local_b68[0x10] = '\0';
  local_b68._32_4_ = -1;
  local_b68._40_8_ = local_b68 + 0x38;
  local_b68._48_8_ = 0;
  local_b68[0x38] = '\0';
  local_b18._M_color = _S_red;
  local_b18._M_parent = (_Base_ptr)0x0;
  local_af8 = 0;
  local_af0._M_p = (pointer)&local_ae0;
  local_ae8 = 0;
  local_ae0._M_local_buf[0] = '\0';
  local_ad0._M_p = (pointer)&local_ac0;
  local_ac8 = 0;
  local_ac0._M_local_buf[0] = '\0';
  local_ab0 = 0;
  _Stack_aa8._M_unused._M_object = (void *)0x0;
  _Stack_aa8._8_8_ = 0;
  p_Stack_a98 = (_Manager_type)0x0;
  local_a90 = (_Invoker_type)0x0;
  _Stack_a88._M_unused._M_object = (void *)0x0;
  _Stack_a88._8_8_ = 0;
  uStack_a78 = 0;
  uStack_a76 = 0;
  uStack_a70 = 0;
  uStack_a6e = 0;
  local_b18._M_left = &local_b18;
  local_b18._M_right = &local_b18;
  std::__cxx11::string::_M_replace((ulong)local_b68,0,(char *)0x0,0x15228e);
  p_Var12 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
  local_be8 = this;
  local_be0 = strm;
  if ((_Rb_tree_header *)p_Var12 != p_Var1) {
    p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_b68 + 0x48);
    do {
      __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(p_Var12 + 1);
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)p_Var2,(key_type *)__v);
      if (iVar11._M_node == &local_b18) {
        pVar24 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::_M_get_insert_equal_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)p_Var2,(key_type *)__v);
        local_c18._0_8_ = p_Var2;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                  (p_Var2,pVar24.first,pVar24.second,__v,(_Alloc_node *)local_c18);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var1);
  }
  pSVar5 = local_be0;
  iVar9 = (*local_be0->_vptr_Stream[7])(local_be0);
  pSVar4 = local_be8;
  if (iVar9 < 0x400) {
    sVar17 = local_ba8.glowable_buffer_._M_string_length;
    if (local_ba8.glowable_buffer_._M_string_length == 0) {
      sVar17 = local_ba8.fixed_buffer_used_size_;
    }
    if (0x2000 < sVar17) {
      local_c08._8_8_ = local_c18 + 8;
      local_c18._8_4_ = _S_red;
      local_c08._M_allocated_capacity = 0;
      local_bf0 = 0;
      local_bf8 = (_Base_ptr)local_c08._8_8_;
      detail::read_headers(pSVar5,(Headers *)local_c18);
      local_b68._32_4_ = 0x19e;
      bVar6 = write_response_core(pSVar4,pSVar5,close_connection,(Request *)local_a60,
                                  (Response *)local_b68,false);
      goto LAB_0013d412;
    }
    psVar18 = &local_ba8.glowable_buffer_;
    if (local_ba8.glowable_buffer_._M_string_length == 0) {
      psVar18 = (string *)&local_ba8.fixed_buffer_;
    }
    bVar7 = parse_request_line(local_be8,(psVar18->_M_dataplus)._M_p,(Request *)local_a60);
    if (bVar7) {
      bVar7 = detail::read_headers(pSVar5,(Headers *)&local_a20);
      if (!bVar7) goto LAB_0013d50a;
      p_Var2 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)(local_c18 + 0x10);
      local_c18._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"Connection","");
      pVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_a20,(key_type *)local_c18);
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c18._0_8_ != p_Var2) {
        operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
      }
      if (pVar25.first._M_node._M_node == pVar25.second._M_node._M_node) {
        pcVar22 = "";
      }
      else {
        pcVar22 = *(char **)(pVar25.first._M_node._M_node + 2);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_bd8,pcVar22,(allocator<char> *)local_c18);
      iVar9 = std::__cxx11::string::compare((char *)local_bd8);
      if (local_bd8[0] != local_bc8) {
        operator_delete(local_bd8[0],local_bc8[0] + 1);
      }
      if (iVar9 == 0) {
        *local_bb8 = true;
      }
      iVar9 = std::__cxx11::string::compare((char *)&local_9a8);
      if (iVar9 == 0) {
        Request::get_header_value_abi_cxx11_
                  ((string *)local_c18,(Request *)local_a60,"Connection",0);
        iVar9 = std::__cxx11::string::compare(local_c18);
        if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)local_c18._0_8_ != p_Var2) {
          operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
        }
        if (iVar9 != 0) {
          *local_bb8 = true;
        }
      }
      (*local_be0->_vptr_Stream[6])(local_be0,&local_9d0,local_9b0);
      local_c18._0_8_ = "REMOTE_ADDR";
      cVar20 = 'R';
      lVar19 = 1;
      do {
        if ((cVar20 == '\n') || (cVar20 == '\r')) goto LAB_0013d687;
        cVar20 = "REMOTE_ADDR"[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xc);
      cVar20 = *local_9d0._M_dataplus._M_p;
      _Var13._M_p = local_9d0._M_dataplus._M_p;
      while (cVar20 != '\0') {
        _Var13._M_p = _Var13._M_p + 1;
        if ((cVar20 == '\n') || (cVar20 == '\r')) goto LAB_0013d687;
        cVar20 = *_Var13._M_p;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_a20,(char **)local_c18,&local_9d0);
LAB_0013d687:
      __val = -local_9b0[0];
      if (0 < (int)local_9b0[0]) {
        __val = local_9b0[0];
      }
      __len = 1;
      if (9 < __val) {
        uVar21 = (ulong)__val;
        uVar23 = 4;
        do {
          __len = uVar23;
          uVar16 = (uint)uVar21;
          if (uVar16 < 100) {
            __len = __len - 2;
            goto LAB_0013d6ec;
          }
          if (uVar16 < 1000) {
            __len = __len - 1;
            goto LAB_0013d6ec;
          }
          if (uVar16 < 10000) goto LAB_0013d6ec;
          uVar21 = uVar21 / 10000;
          uVar23 = __len + 4;
        } while (99999 < uVar16);
        __len = __len + 1;
      }
LAB_0013d6ec:
      uVar23 = local_9b0[0] >> 0x1f;
      local_c18._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct
                ((ulong)local_c18,(char)__len - (char)((int)local_9b0[0] >> 0x1f));
      __first = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)(local_c18._0_8_ + (ulong)uVar23);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)__first,__len,__val);
      local_bd8[0] = (long *)0x1522ae;
      cVar20 = 'R';
      lVar19 = 1;
      do {
        if ((cVar20 == '\n') || (cVar20 == '\r')) goto LAB_0013d782;
        cVar20 = "REMOTE_PORT"[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xc);
      _Var3 = *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_c18._0_8_;
      p_Var14 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)local_c18._0_8_;
      while (_Var3 != (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       )0x0) {
        p_Var14 = p_Var14 + 1;
        if ((_Var3 == (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       )0xa) ||
           (_Var3 == (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      )0xd)) goto LAB_0013d782;
        _Var3 = *p_Var14;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&local_a20,(char **)local_bd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c18);
LAB_0013d782:
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c18._0_8_ != p_Var2) {
        operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
      }
      local_c18._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"Range","");
      cVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&local_a20,(key_type *)local_c18);
      if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *)local_c18._0_8_ != p_Var2) {
        operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)cVar15._M_node == &local_a20._M_impl.super__Rb_tree_header) {
LAB_0013d879:
        if (*(long *)(local_bb0 + 1) != 0) {
          (**(code **)((long)local_bb0 + 0x18))(local_bb0,(Request *)local_a60);
        }
        local_c18._0_8_ = p_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"Expect","");
        pVar25 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::equal_range(&local_a20,(key_type *)local_c18);
        if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)local_c18._0_8_ != p_Var2) {
          operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
        }
        if (pVar25.first._M_node._M_node == pVar25.second._M_node._M_node) {
          pcVar22 = "";
        }
        else {
          pcVar22 = *(char **)(pVar25.first._M_node._M_node + 2);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_bd8,pcVar22,(allocator<char> *)local_c18);
        iVar9 = std::__cxx11::string::compare((char *)local_bd8);
        if (local_bd8[0] != local_bc8) {
          operator_delete(local_bd8[0],local_bc8[0] + 1);
        }
        pSVar5 = local_be0;
        pSVar4 = local_be8;
        if (iVar9 == 0) {
          local_bd8[0] = (long *)CONCAT44(local_bd8[0]._4_4_,100);
          if ((local_be8->expect_100_continue_handler_).super__Function_base._M_manager ==
              (_Manager_type)0x0) {
            iVar9 = 100;
          }
          else {
            iVar9 = (*(local_be8->expect_100_continue_handler_)._M_invoker)
                              ((_Any_data *)&local_be8->expect_100_continue_handler_,
                               (Request *)local_a60,(Response *)local_b68);
            local_bd8[0] = (long *)CONCAT44(local_bd8[0]._4_4_,iVar9);
            if ((iVar9 != 0x1a1) && (iVar9 != 100)) {
              bVar6 = write_response_core(pSVar4,pSVar5,close_connection,(Request *)local_a60,
                                          (Response *)local_b68,false);
              goto LAB_0013d41f;
            }
          }
          local_c18._0_8_ = detail::status_message(iVar9);
          Stream::write_format<int,char_const*>
                    (pSVar5,"HTTP/1.1 %d %s\r\n\r\n",(int *)local_bd8,(char **)local_c18);
        }
        bVar7 = routing(pSVar4,(Request *)local_a60,(Response *)local_b68,pSVar5);
        if (bVar7) {
          bVar7 = true;
          if (local_b68._32_4_ == -1) {
            local_b68._32_4_ = 0xce;
            if (local_908[0].
                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_908[0].
                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              local_b68._32_4_ = 200;
            }
            bVar7 = true;
          }
        }
        else {
          bVar7 = false;
          if (local_b68._32_4_ == -1) {
            local_b68._32_4_ = 0x194;
          }
        }
        bVar6 = write_response_core(local_be8,local_be0,close_connection,(Request *)local_a60,
                                    (Response *)local_b68,bVar7);
      }
      else {
        Request::get_header_value_abi_cxx11_((string *)local_c18,(Request *)local_a60,"Range",0);
        bVar7 = detail::parse_range_header((string *)local_c18,local_908);
        if (!bVar7) {
          local_b68._32_4_ = 0x1a0;
          bVar8 = write_response_core(local_be8,local_be0,close_connection,(Request *)local_a60,
                                      (Response *)local_b68,false);
          __first = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)(ulong)bVar8;
        }
        bVar6 = (byte)__first;
        if ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)local_c18._0_8_ != p_Var2) {
          operator_delete((void *)local_c18._0_8_,(ulong)(local_c08._M_allocated_capacity + 1));
        }
        if (bVar7) goto LAB_0013d879;
      }
    }
    else {
LAB_0013d50a:
      local_b68._32_4_ = 400;
      bVar6 = write_response_core(pSVar4,pSVar5,close_connection,(Request *)local_a60,
                                  (Response *)local_b68,false);
    }
  }
  else {
    local_c08._8_8_ = local_c18 + 8;
    local_c18._8_4_ = _S_red;
    local_c08._M_allocated_capacity = 0;
    local_bf0 = 0;
    local_bf8 = (_Base_ptr)local_c08._8_8_;
    detail::read_headers(pSVar5,(Headers *)local_c18);
    local_b68._32_4_ = 500;
    bVar6 = write_response_core(pSVar4,pSVar5,close_connection,(Request *)local_a60,
                                (Response *)local_b68,false);
LAB_0013d412:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_c18);
  }
LAB_0013d41f:
  Response::~Response((Response *)local_b68);
  Request::~Request((Request *)local_a60);
LAB_0013d439:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8.glowable_buffer_._M_dataplus._M_p != &local_ba8.glowable_buffer_.field_2) {
    operator_delete(local_ba8.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_ba8.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_ba8.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

inline bool
Server::process_request(Stream &strm, bool close_connection,
                        bool &connection_closed,
                        const std::function<void(Request &)> &setup_request) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  // Connection has been closed on client
  if (!line_reader.getline()) { return false; }

  Request req;
  Response res;

  res.version = "HTTP/1.1";

  for (const auto &header : default_headers_) {
    if (res.headers.find(header.first) == res.headers.end()) {
      res.headers.insert(header);
    }
  }

#ifdef _WIN32
  // TODO: Increase FD_SETSIZE statically (libzmq), dynamically (MySQL).
#else
#ifndef CPPHTTPLIB_USE_POLL
  // Socket file descriptor exceeded FD_SETSIZE...
  if (strm.socket() >= FD_SETSIZE) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 500;
    return write_response(strm, close_connection, req, res);
  }
#endif
#endif

  // Check if the request URI doesn't exceed the limit
  if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 414;
    return write_response(strm, close_connection, req, res);
  }

  // Request line and headers
  if (!parse_request_line(line_reader.ptr(), req) ||
      !detail::read_headers(strm, req.headers)) {
    res.status = 400;
    return write_response(strm, close_connection, req, res);
  }

  if (req.get_header_value("Connection") == "close") {
    connection_closed = true;
  }

  if (req.version == "HTTP/1.0" &&
      req.get_header_value("Connection") != "Keep-Alive") {
    connection_closed = true;
  }

  strm.get_remote_ip_and_port(req.remote_addr, req.remote_port);
  req.set_header("REMOTE_ADDR", req.remote_addr);
  req.set_header("REMOTE_PORT", std::to_string(req.remote_port));

  if (req.has_header("Range")) {
    const auto &range_header_value = req.get_header_value("Range");
    if (!detail::parse_range_header(range_header_value, req.ranges)) {
      res.status = 416;
      return write_response(strm, close_connection, req, res);
    }
  }

  if (setup_request) { setup_request(req); }

  if (req.get_header_value("Expect") == "100-continue") {
    auto status = 100;
    if (expect_100_continue_handler_) {
      status = expect_100_continue_handler_(req, res);
    }
    switch (status) {
    case 100:
    case 417:
      strm.write_format("HTTP/1.1 %d %s\r\n\r\n", status,
                        detail::status_message(status));
      break;
    default: return write_response(strm, close_connection, req, res);
    }
  }

  // Rounting
  bool routed = false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
  routed = routing(req, res, strm);
#else
  try {
    routed = routing(req, res, strm);
  } catch (std::exception &e) {
    if (exception_handler_) {
      exception_handler_(req, res, e);
      routed = true;
    } else {
      res.status = 500;
      res.set_header("EXCEPTION_WHAT", e.what());
    }
  } catch (...) {
    res.status = 500;
    res.set_header("EXCEPTION_WHAT", "UNKNOWN");
  }
#endif

  if (routed) {
    if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
    return write_response_with_content(strm, close_connection, req, res);
  } else {
    if (res.status == -1) { res.status = 404; }
    return write_response(strm, close_connection, req, res);
  }
}